

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EnsureNoRedeclarations
          (ByteCodeGenerator *this,ParseNodeBlock *pnodeBlock,FuncInfo *funcInfo)

{
  ByteCodeWriter *this_00;
  OpCode OVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  PropertyId PVar5;
  uint uVar6;
  undefined4 *puVar7;
  FuncInfo *this_01;
  ParseNodeVar *pPVar8;
  ParseNodeBlock *pPVar9;
  ParseNodeCatch *pPVar10;
  ParseNodeFnc *pPVar11;
  ParseNodeWith *pPVar12;
  ParseNode *this_02;
  ParseNodePtr pPVar13;
  Symbol *this_03;
  Symbol *pSVar14;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1661,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar4) goto LAB_00814d0f;
    *puVar7 = 0;
  }
  if (((pnodeBlock->field_0x5c & 3) != 0) &&
     (pnodeBlock->scope->scopeType != ScopeType_GlobalEvalBlock)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x1662,
                       "(pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock)"
                       ,
                       "pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock"
                      );
    if (!bVar4) goto LAB_00814d0f;
    *puVar7 = 0;
  }
  if ((this->flags & 0x800) == 0) {
    if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./ByteCode/ByteCodeGenerator.h"
                         ,0x1ef,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
      if (!bVar4) {
LAB_00814d0f:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar7 = 0;
    }
    this_02 = pnodeBlock->pnodeLexVars;
    if (this_02 != (ParseNode *)0x0) {
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      do {
        this_01 = TopFuncInfo(this);
        pPVar8 = ParseNode::AsParseNodeVar(this_02);
        pSVar14 = pPVar8->sym;
        if ((pSVar14->field_0x42 & 8) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x166b,"(sym->GetIsGlobal())","sym->GetIsGlobal()");
          if (!bVar4) goto LAB_00814d0f;
          *puVar7 = 0;
        }
        PVar5 = Symbol::EnsurePosition(pSVar14,this);
        uVar6 = FuncInfo::FindOrAddReferencedPropertyId(this_01,PVar5);
        Js::ByteCodeWriter::ElementRootU(&this->m_writer,EnsureNoRootFld,uVar6);
        pPVar8 = ParseNode::AsParseNodeVar(this_02);
        this_02 = pPVar8->pnodeNext;
      } while (this_02 != (ParseNodePtr)0x0);
    }
  }
  pPVar13 = pnodeBlock->pnodeScopes;
  if (pPVar13 != (ParseNodePtr)0x0) {
    this_00 = &this->m_writer;
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    do {
      OVar1 = pPVar13->nop;
      if (OVar1 < knopWith) {
        if (OVar1 == knopFncDecl) {
          pPVar11 = ParseNode::AsParseNodeFnc(pPVar13);
          if ((pPVar11->fncFlags & kFunctionDeclaration) != kFunctionNone) {
            pPVar11 = ParseNode::AsParseNodeFnc(pPVar13);
            PVar5 = Symbol::EnsurePosition(pPVar11->pnodeName->sym,this);
            uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
            Js::ByteCodeWriter::ElementRootU(this_00,EnsureCanDeclGloFunc,uVar6);
            if ((this->flags & 0x400) == 0) {
              uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
              Js::ByteCodeWriter::ElementRootU(this_00,EnsureNoRootRedeclFld,uVar6);
            }
            else if (((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) {
              uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
              Js::ByteCodeWriter::ScopedProperty
                        (this_00,ScopedEnsureNoRedeclFld,0xfffffffd,uVar6,false);
            }
          }
          pPVar11 = ParseNode::AsParseNodeFnc(pPVar13);
          pPVar13 = pPVar11->pnodeNext;
        }
        else if (OVar1 == knopBlock) {
          pPVar9 = ParseNode::AsParseNodeBlock(pPVar13);
          pPVar13 = pPVar9->pnodeNext;
        }
        else {
LAB_008149be:
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x16a8,"((0))","UNREACHED");
          if (!bVar4) goto LAB_00814d0f;
          *puVar7 = 0;
        }
      }
      else if (OVar1 == knopWith) {
        pPVar12 = ParseNode::AsParseNodeWith(pPVar13);
        pPVar13 = pPVar12->pnodeNext;
      }
      else {
        if (OVar1 != knopCatch) goto LAB_008149be;
        pPVar10 = ParseNode::AsParseNodeCatch(pPVar13);
        pPVar13 = pPVar10->pnodeNext;
      }
    } while (pPVar13 != (ParseNodePtr)0x0);
  }
  pPVar13 = funcInfo->root->pnodeVars;
  if (pPVar13 == (ParseNodePtr)0x0) {
    return;
  }
  puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
LAB_00814b1a:
  pPVar8 = ParseNode::AsParseNodeVar(pPVar13);
  pSVar14 = pPVar8->sym;
  if (((pSVar14 == (Symbol *)0x0) ||
      (pPVar8 = ParseNode::AsParseNodeVar(pPVar13), pPVar8->isBlockScopeFncDeclVar != '\0')) ||
     (bVar4 = Symbol::IsSpecialSymbol(pSVar14), bVar4)) goto LAB_00814ceb;
  uVar2 = *(ushort *)&pSVar14->field_0x42;
  if ((uVar2 & 0x40) == 0) {
    if (((uVar2 & 2) != 0) && (pPVar13->nop == knopVarDecl)) {
      if (((uVar2 & 0x40) == 0) && (funcInfo->bodyScope == pSVar14->scope)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x16bc,"(sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope())",
                           "sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope()");
        if (bVar4) {
          *puVar7 = 0;
          goto LAB_00814bbf;
        }
        goto LAB_00814d0f;
      }
      goto LAB_00814bbf;
    }
  }
  else {
LAB_00814bbf:
    this_03 = funcInfo->bodyScope->m_symList;
    while ((this_03 != (Symbol *)0x0 &&
           (bVar4 = JsUtil::CharacterBuffer<char16_t>::operator==(&this_03->name,&pSVar14->name),
           !bVar4))) {
      this_03 = this_03->next;
    }
    pSVar14 = this_03;
    if ((this_03 == (Symbol *)0x0) || ((this_03->field_0x42 & 0x42) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x16be,"(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar())",
                         "sym && !sym->GetIsCatch() && !sym->GetIsBlockVar()");
      if (!bVar4) goto LAB_00814d0f;
      *puVar7 = 0;
    }
  }
  if ((pSVar14->field_0x42 & 8) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x16c1,"(sym->GetIsGlobal())","sym->GetIsGlobal()");
    if (!bVar4) goto LAB_00814d0f;
    *puVar7 = 0;
  }
  if (pSVar14->symbolType == STVariable) {
    PVar5 = Symbol::EnsurePosition(pSVar14,this);
    if ((this->flags & 0x400) == 0) {
      uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
      Js::ByteCodeWriter::ElementRootU(&this->m_writer,EnsureNoRootRedeclFld,uVar6);
    }
    else if (((funcInfo->byteCodeFunction->super_FunctionProxy).field_0x46 & 1) == 0) {
      uVar6 = FuncInfo::FindOrAddReferencedPropertyId(funcInfo,PVar5);
      Js::ByteCodeWriter::ScopedProperty
                (&this->m_writer,ScopedEnsureNoRedeclFld,0xfffffffd,uVar6,false);
    }
  }
LAB_00814ceb:
  pPVar8 = ParseNode::AsParseNodeVar(pPVar13);
  pPVar13 = pPVar8->pnodeNext;
  if (pPVar13 == (ParseNodePtr)0x0) {
    return;
  }
  goto LAB_00814b1a;
}

Assistant:

void ByteCodeGenerator::EnsureNoRedeclarations(ParseNodeBlock *pnodeBlock, FuncInfo *funcInfo)
{
    // Emit dynamic runtime checks for variable re-declarations. Only necessary for global functions (script or eval).
    // In eval only var declarations can cause redeclaration, and only in non-strict mode, because let/const variables
    // remain local to the eval code.

    Assert(pnodeBlock->nop == knopBlock);
    Assert(pnodeBlock->blockType == PnodeBlockType::Global || pnodeBlock->scope->GetScopeType() == ScopeType_GlobalEvalBlock);

    if (!(this->flags & fscrEvalCode))
    {
        IterateBlockScopedVariables(pnodeBlock, [this](ParseNode *pnode)
        {
            FuncInfo *funcInfo = this->TopFuncInfo();
            Symbol *sym = pnode->AsParseNodeVar()->sym;

            Assert(sym->GetIsGlobal());

            Js::PropertyId propertyId = sym->EnsurePosition(this);

            this->m_writer.ElementRootU(Js::OpCode::EnsureNoRootFld, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        });
    }

    auto emitRedeclCheck = [this](Symbol * sym, FuncInfo * funcInfo, bool isFncDecl = false)
    {
        Js::PropertyId propertyId = sym->EnsurePosition(this);

        // Global function declarations must pass #sec-candeclareglobalfunction
        // which is enforced by EnsureCanDeclGloFunc
        if (isFncDecl)
        {
            this->m_writer.ElementRootU(Js::OpCode::EnsureCanDeclGloFunc, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }

        if (this->flags & fscrEval)
        {
            if (!funcInfo->byteCodeFunction->GetIsStrictMode())
            {
                this->m_writer.ScopedProperty(Js::OpCode::ScopedEnsureNoRedeclFld, ByteCodeGenerator::RootObjectRegister,
                    funcInfo->FindOrAddReferencedPropertyId(propertyId));
            }
        }
        else
        {
            this->m_writer.ElementRootU(Js::OpCode::EnsureNoRootRedeclFld, funcInfo->FindOrAddReferencedPropertyId(propertyId));
        }
    };

    // scan for function declarations
    // these behave like "var" declarations
    for (ParseNodePtr pnode = pnodeBlock->pnodeScopes; pnode;)
    {
        switch (pnode->nop) {

        case knopFncDecl:
            if (pnode->AsParseNodeFnc()->IsDeclaration())
            {
                emitRedeclCheck(pnode->AsParseNodeFnc()->pnodeName->sym, funcInfo, true);
            }

            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;

        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;

        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;

        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;

        default:
            Assert(UNREACHED);
        }
    }

    // scan for var declarations
    for (ParseNode *pnode = funcInfo->root->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
    {
        Symbol* sym = pnode->AsParseNodeVar()->sym;

        if (sym == nullptr || pnode->AsParseNodeVar()->isBlockScopeFncDeclVar || sym->IsSpecialSymbol())
            continue;

        if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
        {
            // The init node was bound to the catch object, because it's inside a catch and has the
            // same name as the catch object. But we want to define a user var at function scope,
            // so find the right symbol. (We'll still assign the RHS value to the catch object symbol.)
            // This also applies to a var declaration in the same scope as a let declaration.

            // Assert that catch cannot be at function scope and let and var at function scope is redeclaration error.
            Assert(sym->GetIsCatch() || funcInfo->bodyScope != sym->GetScope());
            sym = funcInfo->bodyScope->FindLocalSymbol(sym->GetName());
            Assert(sym && !sym->GetIsCatch() && !sym->GetIsBlockVar());
        }

        Assert(sym->GetIsGlobal());

        if (sym->GetSymbolType() == STVariable)
        {
            emitRedeclCheck(sym, funcInfo);
        }
    }
}